

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseBoundValueTypeList
          (WastParser *this,TokenType token,TypeVector *types,BindingHash *bindings,
          Index binding_index_offset)

{
  bool bVar1;
  Result RVar2;
  undefined1 auStack_a8 [8];
  Location loc;
  undefined1 local_58 [8];
  string name;
  Type type;
  
  name.field_2._12_4_ = binding_index_offset;
  while( true ) {
    bVar1 = MatchLpar(this,token);
    if (!bVar1) {
      return (Result)Ok;
    }
    bVar1 = PeekMatch(this,Last_String);
    if (bVar1) {
      local_58 = (undefined1  [8])&name._M_string_length;
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length._0_1_ = 0;
      GetLocation((Location *)auStack_a8,this);
      ParseBindVarOpt(this,(string *)local_58);
      RVar2 = ParseValueType(this,(Type *)(name.field_2._M_local_buf + 8));
      if (RVar2.enum_ == Error) {
        std::__cxx11::string::~string((string *)local_58);
        return (Result)Error;
      }
      loc.field_1.field_0.last_column = auStack_a8._0_4_;
      loc.field_1._12_4_ = auStack_a8._4_4_;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)bindings,local_58,(undefined1 *)((long)&loc.field_1 + 8));
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
                (types,(value_type *)(name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_58);
    }
    else {
      RVar2 = ParseValueTypeList(this,types);
    }
    if (RVar2.enum_ == Error) break;
    RVar2 = Expect(this,Rpar);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseBoundValueTypeList(TokenType token,
                                           TypeVector* types,
                                           BindingHash* bindings,
                                           Index binding_index_offset) {
  WABT_TRACE(ParseBoundValueTypeList);
  while (MatchLpar(token)) {
    if (PeekMatch(TokenType::Var)) {
      std::string name;
      Type type;
      Location loc = GetLocation();
      ParseBindVarOpt(&name);
      CHECK_RESULT(ParseValueType(&type));
      bindings->emplace(name,
                        Binding(loc, binding_index_offset + types->size()));
      types->push_back(type);
    } else {
      CHECK_RESULT(ParseValueTypeList(types));
    }
    EXPECT(Rpar);
  }
  return Result::Ok;
}